

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O0

void Rnm_ManStop(Rnm_Man_t *p,int fProfile)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 local_a8;
  undefined4 local_98;
  undefined4 local_88;
  undefined4 local_78;
  undefined4 local_68;
  abctime timeOther;
  double MemOther;
  double MemGia;
  int fProfile_local;
  Rnm_Man_t *p_local;
  
  if (p != (Rnm_Man_t *)0x0) {
    if ((fProfile != 0) && (p->nCalls != 0)) {
      lVar1 = (long)p->pGia->nTravIdsAlloc * 4 + 1000 + (long)p->pGia->nObjsAlloc * 0xc;
      auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar6._0_8_ = lVar1;
      auVar6._12_4_ = 0x45300000;
      iVar3 = p->nObjsAlloc;
      iVar4 = Vec_IntCap(p->vObjs);
      lVar2 = (long)iVar4 * 4 + 0x80 + (long)iVar3 * 4;
      auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar7._0_8_ = lVar2;
      auVar7._12_4_ = 0x45300000;
      lVar5 = ((p->timeTotal - p->timeFwd) - p->timeBwd) - p->timeVer;
      printf("Abstraction refinement runtime statistics:\n");
      Abc_Print(1,"%s =","Sensetization");
      if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
        local_68 = SUB84(((double)p->timeFwd * 100.0) / (double)p->timeTotal,0);
      }
      else {
        local_68 = 0;
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeFwd * 1.0) / 1000000.0,local_68);
      Abc_Print(1,"%s =","Justification");
      if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
        local_78 = SUB84(((double)p->timeBwd * 100.0) / (double)p->timeTotal,0);
      }
      else {
        local_78 = 0;
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeBwd * 1.0) / 1000000.0,local_78);
      Abc_Print(1,"%s =","Verification ");
      if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
        local_88 = SUB84(((double)p->timeVer * 100.0) / (double)p->timeTotal,0);
      }
      else {
        local_88 = 0;
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeVer * 1.0) / 1000000.0,local_88);
      Abc_Print(1,"%s =","Other        ");
      if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
        local_98 = SUB84(((double)lVar5 * 100.0) / (double)p->timeTotal,0);
      }
      else {
        local_98 = 0;
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar5 * 1.0) / 1000000.0,local_98);
      Abc_Print(1,"%s =","TOTAL        ");
      if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
        local_a8 = SUB84(((double)p->timeTotal * 100.0) / (double)p->timeTotal,0);
      }
      else {
        local_a8 = 0;
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_a8);
      printf("Total calls = %d.  Average refine = %.1f. GIA mem = %.3f MB.  Other mem = %.3f MB.\n",
             ((double)p->nRefines * 1.0) / (double)p->nCalls,
             SUB84(((auVar6._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1048576.0,0),
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1048576.0,
             (ulong)(uint)p->nCalls);
    }
    Gia_ManCleanMark0(p->pGia);
    Gia_ManCleanMark1(p->pGia);
    Gia_ManStaticFanoutStop(p->pGia);
    Vec_StrFree(p->vCounts);
    Vec_IntFree(p->vFanins);
    Vec_IntFree(p->vObjs);
    if (p->pObjs != (Rnm_Obj_t *)0x0) {
      free(p->pObjs);
      p->pObjs = (Rnm_Obj_t *)0x0;
    }
    if (p != (Rnm_Man_t *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void Rnm_ManStop( Rnm_Man_t * p, int fProfile )
{
    if ( !p ) return;
    // print runtime statistics
    if ( fProfile && p->nCalls )
    {
        double MemGia = sizeof(Gia_Man_t) + sizeof(Gia_Obj_t) * p->pGia->nObjsAlloc + sizeof(int) * p->pGia->nTravIdsAlloc;
        double MemOther = sizeof(Rnm_Man_t) + sizeof(Rnm_Obj_t) * p->nObjsAlloc + sizeof(int) * Vec_IntCap(p->vObjs);
        abctime timeOther = p->timeTotal - p->timeFwd - p->timeBwd - p->timeVer;
        printf( "Abstraction refinement runtime statistics:\n" );
        ABC_PRTP( "Sensetization", p->timeFwd,   p->timeTotal );
        ABC_PRTP( "Justification", p->timeBwd,   p->timeTotal );
        ABC_PRTP( "Verification ", p->timeVer,   p->timeTotal );
        ABC_PRTP( "Other        ", timeOther,    p->timeTotal );
        ABC_PRTP( "TOTAL        ", p->timeTotal, p->timeTotal );
        printf( "Total calls = %d.  Average refine = %.1f. GIA mem = %.3f MB.  Other mem = %.3f MB.\n", 
            p->nCalls, 1.0*p->nRefines/p->nCalls, MemGia/(1<<20), MemOther/(1<<20) );
    }

    Gia_ManCleanMark0(p->pGia);
    Gia_ManCleanMark1(p->pGia);
    Gia_ManStaticFanoutStop(p->pGia);
//    Gia_ManSetPhase(p->pGia);
//    Vec_IntFree( p->vIsopMem );
//    Vec_IntFree( p->vSatVars );
//    Vec_IntFree( p->vSat2Ids );
    Vec_StrFree( p->vCounts );
    Vec_IntFree( p->vFanins );
    Vec_IntFree( p->vObjs );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}